

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_examples.c
# Opt level: O1

void test12_should_not_be_parsed(void)

{
  cJSON *item;
  
  item = cJSON_ParseWithOpts("{ \"name\": ",(char **)0x0,0);
  if (item != (cJSON *)0x0) {
    UnityFail("Should fail to parse incomplete JSON.",0xbc);
    UnityAssertEqualNumber
              (0x109459,global_error_0 + global_error_1,"Error pointer is incorrect.",0xbe,
               UNITY_DISPLAY_STYLE_HEX64);
    cJSON_Delete(item);
    return;
  }
  UnityAssertEqualNumber
            (0x109459,global_error_0 + global_error_1,"Error pointer is incorrect.",0xbe,
             UNITY_DISPLAY_STYLE_HEX64);
  return;
}

Assistant:

static void test12_should_not_be_parsed(void)
{
    const char *test12 = "{ \"name\": ";
    cJSON *tree = NULL;

    tree = cJSON_Parse(test12);
    TEST_ASSERT_NULL_MESSAGE(tree, "Should fail to parse incomplete JSON.");

    TEST_ASSERT_EQUAL_PTR_MESSAGE(test12 + strlen(test12), cJSON_GetErrorPtr(), "Error pointer is incorrect.");

    if (tree != NULL)
    {
        cJSON_Delete(tree);
    }
}